

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

Duration * __thiscall absl::Duration::operator+=(Duration *this,Duration rhs)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  bool bVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int64_t iVar7;
  uint uVar8;
  int64_t v;
  Duration DVar9;
  Duration d;
  Duration d_00;
  int64_t local_60;
  uint32_t local_58;
  int64_t orig_rep_hi;
  Duration *this_local;
  Duration rhs_local;
  
  v = rhs.rep_hi_;
  uVar8 = rhs.rep_lo_;
  uVar2 = this->rep_hi_;
  uVar3 = this->rep_lo_;
  DVar9.rep_lo_ = uVar3;
  DVar9.rep_hi_ = uVar2;
  DVar9._12_4_ = 0;
  bVar4 = time_internal::IsInfiniteDuration(DVar9);
  if (!bVar4) {
    d._12_4_ = 0;
    d.rep_hi_ = SUB128(rhs._0_12_,0);
    d.rep_lo_ = SUB124(rhs._0_12_,8);
    bVar4 = time_internal::IsInfiniteDuration(d);
    if (bVar4) {
      this->rep_hi_ = v;
      this->rep_lo_ = uVar8;
    }
    else {
      lVar1 = this->rep_hi_;
      uVar5 = anon_unknown_0::EncodeTwosComp(this->rep_hi_);
      uVar6 = anon_unknown_0::EncodeTwosComp(v);
      iVar7 = anon_unknown_0::DecodeTwosComp(uVar5 + uVar6);
      this->rep_hi_ = iVar7;
      if ((long)(4000000000 - (ulong)uVar8) <= (long)(ulong)this->rep_lo_) {
        uVar5 = anon_unknown_0::EncodeTwosComp(this->rep_hi_);
        iVar7 = anon_unknown_0::DecodeTwosComp(uVar5 + 1);
        this->rep_hi_ = iVar7;
        this->rep_lo_ = this->rep_lo_ + 0x1194d800;
      }
      this->rep_lo_ = uVar8 + this->rep_lo_;
      if (v < 0) {
        if (this->rep_hi_ <= lVar1) {
          return this;
        }
      }
      else if (lVar1 <= this->rep_hi_) {
        return this;
      }
      if (v < 0) {
        DVar9 = InfiniteDuration();
        d_00._12_4_ = 0;
        d_00.rep_hi_ = SUB128(DVar9._0_12_,0);
        d_00.rep_lo_ = SUB124(DVar9._0_12_,8);
        DVar9 = absl::operator-(d_00);
        local_60 = DVar9.rep_hi_;
        local_58 = DVar9.rep_lo_;
      }
      else {
        DVar9 = InfiniteDuration();
        local_60 = DVar9.rep_hi_;
        local_58 = DVar9.rep_lo_;
      }
      this->rep_hi_ = local_60;
      this->rep_lo_ = local_58;
    }
  }
  return this;
}

Assistant:

Duration& Duration::operator+=(Duration rhs) {
  if (time_internal::IsInfiniteDuration(*this)) return *this;
  if (time_internal::IsInfiniteDuration(rhs)) return *this = rhs;
  const int64_t orig_rep_hi = rep_hi_;
  rep_hi_ =
      DecodeTwosComp(EncodeTwosComp(rep_hi_) + EncodeTwosComp(rhs.rep_hi_));
  if (rep_lo_ >= kTicksPerSecond - rhs.rep_lo_) {
    rep_hi_ = DecodeTwosComp(EncodeTwosComp(rep_hi_) + 1);
    rep_lo_ -= kTicksPerSecond;
  }
  rep_lo_ += rhs.rep_lo_;
  if (rhs.rep_hi_ < 0 ? rep_hi_ > orig_rep_hi : rep_hi_ < orig_rep_hi) {
    return *this = rhs.rep_hi_ < 0 ? -InfiniteDuration() : InfiniteDuration();
  }
  return *this;
}